

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O0

value * __thiscall
mjs::anon_unknown_46::json_walk
          (value *__return_storage_ptr__,anon_unknown_46 *this,
          gc_heap_ptr<mjs::global_object> *global,value *reviver,object_ptr *holder,
          wstring_view name)

{
  initializer_list<mjs::value> __l;
  value *pvVar1;
  bool bVar2;
  value_type vVar3;
  wchar_t wVar4;
  object *poVar5;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  wstring_view wVar7;
  undefined1 auVar8 [16];
  wstring_view in_stack_fffffffffffffc38;
  value *local_390;
  allocator<mjs::value> local_2ba;
  undefined1 local_2b9;
  string local_2b8;
  value *local_2a8;
  value local_2a0;
  value local_278;
  iterator local_250;
  undefined1 local_248 [32];
  value local_228;
  wstring_view local_200;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [8];
  value new_element_1;
  wstring_view local_1b0;
  wstring local_1a0 [8];
  wstring key;
  string *p;
  const_iterator __end4;
  const_iterator __begin4;
  vector<mjs::string,_std::allocator<mjs::string>_> *__range4;
  vector<mjs::string,_std::allocator<mjs::string>_> keys;
  string local_138;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  value new_element;
  wstring is;
  undefined1 local_b8 [4];
  uint32_t i;
  value local_a8;
  wchar_t local_80;
  uint32_t len;
  value *local_70;
  object_ptr *o;
  value val;
  gc_heap *h;
  object_ptr *holder_local;
  value *reviver_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  wstring_view name_local;
  
  global_local = (gc_heap_ptr<mjs::global_object> *)holder;
  name_local._M_str = (wchar_t *)__return_storage_ptr__;
  val.field_1._24_8_ = gc_heap_ptr_untyped::heap((gc_heap_ptr_untyped *)this);
  poVar5 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)reviver);
  (**poVar5->_vptr_object)(&o,poVar5,&global_local);
  vVar3 = value::type((value *)&o);
  if (vVar3 == object) {
    local_70 = (value *)value::object_value((value *)&o);
    bVar2 = is_array((object_ptr *)local_70);
    if (bVar2) {
      poVar5 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_70);
      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_b8,L"length");
      (**poVar5->_vptr_object)
                (&local_a8,poVar5,(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_b8
                );
      wVar4 = to_uint32(&local_a8);
      value::~value(&local_a8);
      is.field_2._M_local_buf[3] = L'\0';
      uVar6 = extraout_RDX;
      local_80 = wVar4;
      while( true ) {
        if ((uint)local_80 <= (uint)is.field_2._M_local_buf[3]) break;
        index_string_abi_cxx11_
                  ((wstring *)
                   &new_element.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                    super_gc_heap_ptr_untyped.pos_,(mjs *)(ulong)(uint)is.field_2._M_local_buf[3],
                   (uint32_t)uVar6);
        pvVar1 = local_70;
        auVar8 = std::__cxx11::wstring::operator_cast_to_basic_string_view
                           ((wstring *)
                            &new_element.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>
                             .super_gc_heap_ptr_untyped.pos_);
        local_118 = auVar8;
        json_walk((value *)local_108,this,global,pvVar1,auVar8._0_8_,in_stack_fffffffffffffc38);
        vVar3 = value::type((value *)local_108);
        if (vVar3 == undefined) {
          poVar5 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_70);
          auVar8 = std::__cxx11::wstring::operator_cast_to_basic_string_view
                             ((wstring *)
                              &new_element.field_1.r_.property_name_.
                               super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_);
          local_128 = auVar8;
          (*poVar5->_vptr_object[2])(poVar5,local_128);
        }
        else {
          poVar5 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_70);
          uVar6 = val.field_1._24_8_;
          keys.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)std::__cxx11::wstring::operator_cast_to_basic_string_view
                                  ((wstring *)
                                   &new_element.field_1.r_.property_name_.
                                    super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_
                                  );
          string::string(&local_138,(gc_heap *)uVar6,
                         (wstring_view *)
                         &keys.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage);
          (*poVar5->_vptr_object[1])(poVar5,&local_138,local_108,0);
          string::~string(&local_138);
        }
        value::~value((value *)local_108);
        std::__cxx11::wstring::~wstring
                  ((wstring *)
                   &new_element.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                    super_gc_heap_ptr_untyped.pos_);
        is.field_2._M_local_buf[3] = is.field_2._M_local_buf[3] + L'\x01';
        uVar6 = extraout_RDX_00;
      }
    }
    else {
      poVar5 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_70);
      object::own_property_names
                ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__range4,poVar5,true);
      __end4 = std::vector<mjs::string,_std::allocator<mjs::string>_>::begin
                         ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__range4);
      p = (string *)
          std::vector<mjs::string,_std::allocator<mjs::string>_>::end
                    ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__range4);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end4,(__normal_iterator<const_mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_>
                                    *)&p);
        if (!bVar2) break;
        key.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<const_mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_>
             ::operator*(&__end4);
        wVar7 = string::view((string *)key.field_2._8_8_);
        local_1b0 = wVar7;
        std::allocator<wchar_t>::allocator();
        std::__cxx11::wstring::
        wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
                  (local_1a0,&local_1b0,
                   (allocator<wchar_t> *)
                   &new_element_1.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                    super_gc_heap_ptr_untyped.field_0xf);
        std::allocator<wchar_t>::~allocator
                  ((allocator<wchar_t> *)
                   &new_element_1.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                    super_gc_heap_ptr_untyped.field_0xf);
        pvVar1 = local_70;
        auVar8 = std::__cxx11::wstring::operator_cast_to_basic_string_view(local_1a0);
        local_1f0 = auVar8;
        json_walk((value *)local_1e0,this,global,pvVar1,auVar8._0_8_,in_stack_fffffffffffffc38);
        vVar3 = value::type((value *)local_1e0);
        if (vVar3 == undefined) {
          poVar5 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_70);
          wVar7 = string::view((string *)key.field_2._8_8_);
          local_200 = wVar7;
          (*poVar5->_vptr_object[2])(poVar5,&local_200);
        }
        else {
          poVar5 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_70);
          (*poVar5->_vptr_object[1])(poVar5,key.field_2._8_8_,local_1e0,0);
        }
        value::~value((value *)local_1e0);
        std::__cxx11::wstring::~wstring(local_1a0);
        __gnu_cxx::
        __normal_iterator<const_mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_>
        ::operator++(&__end4);
      }
      std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
                ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__range4);
    }
  }
  value::value(&local_228,(object_ptr *)reviver);
  local_2b9 = 1;
  local_2a8 = &local_2a0;
  string::string(&local_2b8,(gc_heap *)val.field_1._24_8_,(wstring_view *)&global_local);
  value::value(&local_2a0,&local_2b8);
  local_2a8 = &local_278;
  value::value(local_2a8,(value *)&o);
  local_2b9 = 0;
  local_250 = &local_2a0;
  local_248._0_8_ = 9.88131291682493e-324;
  std::allocator<mjs::value>::allocator(&local_2ba);
  __l._M_len = local_248._0_8_;
  __l._M_array = local_250;
  std::vector<mjs::value,_std::allocator<mjs::value>_>::vector
            ((vector<mjs::value,_std::allocator<mjs::value>_> *)(local_248 + 8),__l,&local_2ba);
  call_function(__return_storage_ptr__,(value *)global,&local_228,
                (vector<mjs::value,_std::allocator<mjs::value>_> *)(local_248 + 8));
  std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
            ((vector<mjs::value,_std::allocator<mjs::value>_> *)(local_248 + 8));
  std::allocator<mjs::value>::~allocator(&local_2ba);
  local_390 = (value *)&local_250;
  do {
    local_390 = local_390 + -1;
    value::~value(local_390);
  } while (local_390 != &local_2a0);
  string::~string(&local_2b8);
  value::~value(&local_228);
  value::~value((value *)&o);
  return __return_storage_ptr__;
}

Assistant:

value json_walk(const gc_heap_ptr<global_object>& global, const value& reviver, const object_ptr& holder, const std::wstring_view name) {
    auto& h = global.heap();

    const auto val = holder->get(name);
    if (val.type() == value_type::object) {
        const auto& o = val.object_value();
        if (is_array(o)) {
            const uint32_t len = to_uint32(o->get(L"length"));
            for (uint32_t i = 0; i < len; ++i) {
                const auto is = index_string(i);
                auto new_element = json_walk(global, reviver, o, is);
                if (new_element.type() == value_type::undefined) {
                    o->delete_property(is);
                } else {
                    o->put(string{h, is}, new_element);
                }
            }
        } else {
            const auto keys = o->own_property_names(true);
            for (const auto& p: keys) {
                const std::wstring key{p.view()}; // Keep local copy in case p gets moved during the walk
                auto new_element = json_walk(global, reviver, o, key);
                if (new_element.type() == value_type::undefined) {
                    o->delete_property(p.view());
                } else {
                    o->put(p, new_element);
                }
            }
        }
    }
    return call_function(reviver, value{holder}, { value{string{h, name}}, val });
}